

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall
ScriptHash_ScriptHash_script_witness_Test::ScriptHash_ScriptHash_script_witness_Test
          (ScriptHash_ScriptHash_script_witness_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c3c18;
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_script_witness) {
  Script script("76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac");
  ScriptHash script_hash(script, true);
  // OP_0 SHA256(script)
  EXPECT_STREQ(
      script_hash.GetHex().c_str(),
      "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
}